

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O3

bool crnlib::create_texture_mipmaps
               (mipmapped_texture *work_tex,crn_comp_params *params,crn_mipmap_params *mipmap_params
               ,bool generate_mipmaps)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  crn_mip_mode cVar5;
  uint uVar6;
  uint uVar7;
  crn_bool cVar8;
  crn_comp_params *pcVar9;
  bool bVar10;
  undefined7 in_register_00000009;
  uint uVar11;
  undefined4 uVar12;
  uint height;
  undefined8 unaff_RBP;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  uint width;
  bool bVar17;
  bool bVar18;
  int uheight;
  int uwidth;
  int lheight;
  int lwidth;
  uint local_88;
  uint local_84;
  undefined4 local_80;
  undefined4 local_7c;
  crn_comp_params *local_78;
  uint local_70;
  uint local_6c;
  timer local_68;
  generate_mipmap_params local_50;
  undefined7 uVar13;
  
  local_7c = (undefined4)CONCAT71(in_register_00000009,generate_mipmaps);
  cVar5 = mipmap_params->m_mode;
  uVar13 = (undefined7)((ulong)unaff_RBP >> 8);
  uVar12 = (undefined4)CONCAT71(uVar13,1);
  local_78 = params;
  if (cVar5 == cCRNMipModeNoMips) {
    mipmapped_texture::discard_mipmaps(work_tex);
  }
  else if (cVar5 == cCRNMipModeGenerateMips) {
    uVar12 = 0;
  }
  else if ((cVar5 == cCRNMipModeUseSourceOrGenerateMips) && ((work_tex->m_faces).m_size != 0)) {
    uVar12 = (undefined4)CONCAT71(uVar13,((work_tex->m_faces).m_p)->m_size != 1);
  }
  uVar16 = mipmap_params->m_window_left;
  uVar11 = mipmap_params->m_window_top;
  width = mipmap_params->m_window_right - uVar16;
  height = mipmap_params->m_window_bottom - uVar11;
  local_80 = uVar12;
  if ((height != 0 && (int)uVar11 <= (int)mipmap_params->m_window_bottom) &&
      (width != 0 && (int)uVar16 <= (int)mipmap_params->m_window_right)) {
    if ((work_tex->m_faces).m_size < 2) {
      console::info("Cropping input texture from window (%ux%u)-(%ux%u)",(ulong)uVar16,(ulong)uVar11
                   );
      bVar10 = mipmapped_texture::crop(work_tex,uVar16,uVar11,width,height);
      if (bVar10) goto LAB_00148d5d;
      pcVar15 = "Failed cropping window rect";
    }
    else {
      pcVar15 = "Can\'t crop cubemap textures";
    }
    console::warning(pcVar15);
  }
LAB_00148d5d:
  uVar16 = work_tex->m_width;
  uVar11 = work_tex->m_height;
  uVar6 = mipmap_params->m_clamp_width;
  local_88 = uVar11;
  local_84 = uVar16;
  if ((((uVar6 != 0) && (uVar7 = mipmap_params->m_clamp_height, uVar7 != 0)) &&
      ((int)uVar6 < (int)uVar16 || (int)uVar7 < (int)uVar11)) && (mipmap_params->m_clamp_scale == 0)
     ) {
    if ((work_tex->m_faces).m_size < 2) {
      if (uVar6 < uVar16) {
        uVar16 = uVar6;
      }
      if (uVar7 < uVar11) {
        uVar11 = uVar7;
      }
      local_88 = uVar11;
      local_84 = uVar16;
      console::info("Clamping input texture to %ux%u",(ulong)uVar16,(ulong)uVar11);
      mipmapped_texture::crop(work_tex,0,0,uVar16,uVar11);
    }
    else {
      console::warning("Can\'t crop cubemap textures");
    }
  }
  if (mipmap_params->m_scale_mode != cCRNSMDisabled) {
    bVar10 = (uVar16 ^ uVar16 - 1) <= uVar16 - 1;
    bVar17 = uVar11 == 0;
    bVar18 = (uVar11 & uVar11 - 1) != 0;
    switch(mipmap_params->m_scale_mode) {
    case cCRNSMAbsolute:
      local_84 = (uint)(long)mipmap_params->m_scale_x;
      local_88 = (uint)(long)mipmap_params->m_scale_y;
      break;
    case cCRNSMRelative:
      local_84 = (uint)(long)((float)(int)uVar16 * mipmap_params->m_scale_x + 0.5);
      local_88 = (uint)(long)((float)(int)uVar11 * mipmap_params->m_scale_y + 0.5);
      break;
    case cCRNSMLowerPow2:
      if ((bVar17 || bVar10) || bVar18) {
        math::compute_lower_pow2_dim((int *)&local_84,(int *)&local_88);
      }
      break;
    case cCRNSMNearestPow2:
      if ((bVar17 || bVar10) || bVar18) {
        local_50.super_resample_params.m_pFilter =
             (char *)CONCAT44(local_50.super_resample_params.m_pFilter._4_4_,uVar16);
        local_68.m_start_time._0_4_ = uVar11;
        math::compute_lower_pow2_dim((int *)&local_50,(int *)&local_68);
        local_6c = local_84;
        local_70 = local_88;
        math::compute_upper_pow2_dim((int *)&local_6c,(int *)&local_70);
        uVar11 = local_84 - (uint)local_50.super_resample_params.m_pFilter;
        uVar16 = -uVar11;
        if (0 < (int)uVar11) {
          uVar16 = uVar11;
        }
        local_84 = local_84 - local_6c;
        uVar11 = -local_84;
        if (0 < (int)local_84) {
          uVar11 = local_84;
        }
        local_84 = local_6c;
        if (uVar16 < uVar11) {
          local_84 = (uint)local_50.super_resample_params.m_pFilter;
        }
        uVar11 = local_88 - (uint)local_68.m_start_time;
        uVar16 = -uVar11;
        if (0 < (int)uVar11) {
          uVar16 = uVar11;
        }
        local_88 = local_88 - local_70;
        uVar11 = -local_88;
        if (0 < (int)local_88) {
          uVar11 = local_88;
        }
        local_88 = local_70;
        if (uVar16 < uVar11) {
          local_88 = (uint)local_68.m_start_time;
        }
      }
      break;
    case cCRNSMNextPow2:
      if ((bVar17 || bVar10) || bVar18) {
        math::compute_upper_pow2_dim((int *)&local_84,(int *)&local_88);
      }
    }
  }
  pcVar9 = local_78;
  uVar16 = mipmap_params->m_clamp_width;
  if (((uVar16 != 0) && (uVar11 = mipmap_params->m_clamp_height, uVar11 != 0)) &&
     (((int)uVar16 < (int)local_84 || (int)uVar11 < (int)local_88 &&
      (mipmap_params->m_clamp_scale != 0)))) {
    if (uVar16 < local_84) {
      local_84 = uVar16;
    }
    if (uVar11 < local_88) {
      local_88 = uVar11;
    }
  }
  if (0xfff < (int)local_84) {
    local_84 = 0x1000;
  }
  if ((int)local_84 < 2) {
    local_84 = 1;
  }
  uVar16 = 0x1000;
  if ((int)local_88 < 0x1000) {
    uVar16 = local_88;
  }
  local_88 = uVar16;
  if ((int)uVar16 < 2) {
    local_88 = 1;
  }
  if (((local_84 != work_tex->m_width) || (local_88 != work_tex->m_height)) ||
     ((mipmap_params->m_renormalize == 1 && (mipmap_params->m_rtopmip == 1)))) {
    console::info("Resampling input texture to %ux%u");
    local_50.super_resample_params.m_pFilter = crn_get_mip_filter_name(mipmap_params->m_filter);
    local_50.super_resample_params.m_gamma = mipmap_params->m_gamma;
    local_50.super_resample_params.m_filter_scale = 1.0;
    local_50.super_resample_params.m_srgb = mipmap_params->m_gamma_filtering != 0;
    local_50.super_resample_params.m_wrapping =
         (work_tex->m_faces).m_size == 0 && mipmap_params->m_tiled != 0;
    local_50.super_resample_params.m_renormalize = mipmap_params->m_renormalize != 0;
    local_50.super_resample_params.m_rtopmip = false;
    local_50.super_resample_params.m_multithreaded = pcVar9->m_num_helper_threads != 0;
    bVar10 = mipmapped_texture::resize(work_tex,local_84,local_88,&local_50.super_resample_params);
    if (!bVar10) {
      pcVar15 = "Failed resizing texture!";
      goto LAB_00149151;
    }
  }
  if ((char)local_80 != '\0' || (char)local_7c != '\x01') {
    return true;
  }
  cVar8 = mipmap_params->m_gamma_filtering;
  local_50.super_resample_params.m_pFilter = crn_get_mip_filter_name(mipmap_params->m_filter);
  uVar1 = mipmap_params->m_gamma;
  uVar3 = mipmap_params->m_blurriness;
  local_50.super_resample_params.m_gamma = (float)uVar1;
  local_50.super_resample_params.m_filter_scale = (float)uVar3;
  local_50.super_resample_params.m_srgb = cVar8 != 0;
  local_50.super_resample_params.m_wrapping = mipmap_params->m_tiled != 0;
  local_50.super_resample_params.m_renormalize = mipmap_params->m_renormalize != 0;
  local_50.super_resample_params.m_rtopmip = false;
  local_50.super_resample_params.m_multithreaded = pcVar9->m_num_helper_threads != 0;
  uVar2 = mipmap_params->m_max_levels;
  uVar4 = mipmap_params->m_min_mip_size;
  local_50.m_max_mips = uVar2;
  local_50.m_min_mip_size = uVar4;
  console::info("Generating mipmaps using filter \"%s\"",local_50.super_resample_params.m_pFilter);
  timer::timer(&local_68);
  timer::start(&local_68);
  bVar10 = mipmapped_texture::generate_mipmaps(work_tex,&local_50,true);
  if (bVar10) {
    timer::get_elapsed_secs(&local_68);
    if ((work_tex->m_faces).m_size == 0) {
      uVar14 = 0xffffffff;
    }
    else {
      uVar14 = (ulong)(((work_tex->m_faces).m_p)->m_size - 1);
    }
    console::info("Generated %u mipmap levels in %3.3fs",uVar14);
    return true;
  }
  pcVar15 = "Failed generating mipmaps!";
LAB_00149151:
  console::error(pcVar15);
  return false;
}

Assistant:

bool create_texture_mipmaps(mipmapped_texture& work_tex, const crn_comp_params& params, const crn_mipmap_params& mipmap_params, bool generate_mipmaps)
    {
        crn_comp_params new_params(params);

        bool generate_new_mips = false;

        switch (mipmap_params.m_mode)
        {
        case cCRNMipModeUseSourceOrGenerateMips:
        {
            if (work_tex.get_num_levels() == 1)
            {
                generate_new_mips = true;
            }
            break;
        }
        case cCRNMipModeUseSourceMips:
        {
            break;
        }
        case cCRNMipModeGenerateMips:
        {
            generate_new_mips = true;
            break;
        }
        case cCRNMipModeNoMips:
        {
            work_tex.discard_mipmaps();
            break;
        }
        default:
        {
            CRNLIB_ASSERT(0);
            break;
        }
        }

        rect window_rect(mipmap_params.m_window_left, mipmap_params.m_window_top, mipmap_params.m_window_right, mipmap_params.m_window_bottom);

        if (!window_rect.is_empty())
        {
            if (work_tex.get_num_faces() > 1)
            {
                console::warning("Can't crop cubemap textures");
            }
            else
            {
                console::info("Cropping input texture from window (%ux%u)-(%ux%u)", window_rect.get_left(), window_rect.get_top(), window_rect.get_right(), window_rect.get_bottom());

                if (!work_tex.crop(window_rect.get_left(), window_rect.get_top(), window_rect.get_width(), window_rect.get_height()))
                {
                    console::warning("Failed cropping window rect");
                }
            }
        }

        int new_width = work_tex.get_width();
        int new_height = work_tex.get_height();

        if ((mipmap_params.m_clamp_width) && (mipmap_params.m_clamp_height))
        {
            if ((new_width > (int)mipmap_params.m_clamp_width) || (new_height > (int)mipmap_params.m_clamp_height))
            {
                if (!mipmap_params.m_clamp_scale)
                {
                    if (work_tex.get_num_faces() > 1)
                    {
                        console::warning("Can't crop cubemap textures");
                    }
                    else
                    {
                        new_width = math::minimum<uint>(mipmap_params.m_clamp_width, new_width);
                        new_height = math::minimum<uint>(mipmap_params.m_clamp_height, new_height);
                        console::info("Clamping input texture to %ux%u", new_width, new_height);
                        work_tex.crop(0, 0, new_width, new_height);
                    }
                }
            }
        }

        if (mipmap_params.m_scale_mode != cCRNSMDisabled)
        {
            bool is_pow2 = math::is_power_of_2((uint32)new_width) && math::is_power_of_2((uint32)new_height);

            switch (mipmap_params.m_scale_mode)
            {
            case cCRNSMAbsolute:
            {
                new_width = (uint)mipmap_params.m_scale_x;
                new_height = (uint)mipmap_params.m_scale_y;
                break;
            }
            case cCRNSMRelative:
            {
                new_width = (uint)(mipmap_params.m_scale_x * new_width + .5f);
                new_height = (uint)(mipmap_params.m_scale_y * new_height + .5f);
                break;
            }
            case cCRNSMLowerPow2:
            {
                if (!is_pow2)
                {
                    math::compute_lower_pow2_dim(new_width, new_height);
                }
                break;
            }
            case cCRNSMNearestPow2:
            {
                if (!is_pow2)
                {
                    int lwidth = new_width;
                    int lheight = new_height;
                    math::compute_lower_pow2_dim(lwidth, lheight);

                    int uwidth = new_width;
                    int uheight = new_height;
                    math::compute_upper_pow2_dim(uwidth, uheight);

                    if (labs(new_width - lwidth) < labs(new_width - uwidth))
                    {
                        new_width = lwidth;
                    }
                    else
                    {
                        new_width = uwidth;
                    }

                    if (labs(new_height - lheight) < labs(new_height - uheight))
                    {
                        new_height = lheight;
                    }
                    else
                    {
                        new_height = uheight;
                    }
                }
                break;
            }
            case cCRNSMNextPow2:
            {
                if (!is_pow2)
                {
                    math::compute_upper_pow2_dim(new_width, new_height);
                }
                break;
            }
            default:
                break;
            }
        }

        if ((mipmap_params.m_clamp_width) && (mipmap_params.m_clamp_height))
        {
            if ((new_width > (int)mipmap_params.m_clamp_width) || (new_height > (int)mipmap_params.m_clamp_height))
            {
                if (mipmap_params.m_clamp_scale)
                {
                    new_width = math::minimum<uint>(mipmap_params.m_clamp_width, new_width);
                    new_height = math::minimum<uint>(mipmap_params.m_clamp_height, new_height);
                }
            }
        }

        new_width = math::clamp<int>(new_width, 1, cCRNMaxLevelResolution);
        new_height = math::clamp<int>(new_height, 1, cCRNMaxLevelResolution);

        if ((new_width != (int)work_tex.get_width()) || (new_height != (int)work_tex.get_height()) || (mipmap_params.m_renormalize == true && mipmap_params.m_rtopmip == true))
        {
            console::info("Resampling input texture to %ux%u", new_width, new_height);

            const char* pFilter = crn_get_mip_filter_name(mipmap_params.m_filter);

            bool srgb = mipmap_params.m_gamma_filtering != 0;

            mipmapped_texture::resample_params res_params;
            res_params.m_pFilter = pFilter;
            res_params.m_wrapping = mipmap_params.m_tiled != 0;
            if (work_tex.get_num_faces())
            {
                res_params.m_wrapping = false;
            }
            res_params.m_renormalize = mipmap_params.m_renormalize != 0;
            res_params.m_filter_scale = 1.0f;
            res_params.m_gamma = mipmap_params.m_gamma;
            res_params.m_srgb = srgb;
            res_params.m_multithreaded = (params.m_num_helper_threads > 0);

            if (!work_tex.resize(new_width, new_height, res_params))
            {
                console::error("Failed resizing texture!");
                return false;
            }
        }

        if ((generate_new_mips) && (generate_mipmaps))
        {
            bool srgb = mipmap_params.m_gamma_filtering != 0;

            const char* pFilter = crn_get_mip_filter_name(mipmap_params.m_filter);

            mipmapped_texture::generate_mipmap_params gen_params;
            gen_params.m_pFilter = pFilter;
            gen_params.m_wrapping = mipmap_params.m_tiled != 0;
            gen_params.m_renormalize = mipmap_params.m_renormalize != 0;
            gen_params.m_filter_scale = mipmap_params.m_blurriness;
            gen_params.m_gamma = mipmap_params.m_gamma;
            gen_params.m_srgb = srgb;
            gen_params.m_multithreaded = params.m_num_helper_threads > 0;
            gen_params.m_max_mips = mipmap_params.m_max_levels;
            gen_params.m_min_mip_size = mipmap_params.m_min_mip_size;

            console::info("Generating mipmaps using filter \"%s\"", pFilter);

            timer tm;
            tm.start();
            if (!work_tex.generate_mipmaps(gen_params, true))
            {
                console::error("Failed generating mipmaps!");
                return false;
            }
            double t = tm.get_elapsed_secs();

            console::info("Generated %u mipmap levels in %3.3fs", work_tex.get_num_levels() - 1, t);
        }

        return true;
    }